

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)303>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  int32 modelVersion;
  ModelDescription *pMVar2;
  NeuralNetworkRegressor *nn;
  undefined1 local_80 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  undefined1 local_40 [8];
  Result r;
  Model *format_local;
  
  r.m_message.field_2._8_8_ = format;
  pMVar2 = Specification::Model::description(format);
  modelVersion = Specification::Model::specificationversion((Model *)r.m_message.field_2._8_8_);
  validateRegressorInterface((Result *)local_40,pMVar2,modelVersion);
  bVar1 = Result::good((Result *)local_40);
  if (bVar1) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_80);
    pMVar2 = Specification::Model::description((Model *)r.m_message.field_2._8_8_);
    nn = Specification::Model::neuralnetworkregressor((Model *)r.m_message.field_2._8_8_);
    bVar1 = Specification::Model::isupdatable((Model *)r.m_message.field_2._8_8_);
    validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkRegressor>
              (__return_storage_ptr__,pMVar2,nn,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_80,bVar1);
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_80);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_40);
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  Result::~Result((Result *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkRegressor>(const Specification::Model& format) {
        // must have regressor parameters
        Result r = validateRegressorInterface(format.description(), format.specificationversion());
        if (!r.good()) {
            return r;
        }
        
        std::set<std::string> outputBlobNames;
        return validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkregressor(), outputBlobNames, format.isupdatable());
    }